

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseMarkupDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlParserInputPtr pxVar3;
  
  pxVar3 = ctxt->input;
  if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar3 = ctxt->input;
  }
  pxVar2 = pxVar3->cur;
  if (*pxVar2 == '<') {
    if (pxVar2[1] == '?') {
      xmlParsePI(ctxt);
      return;
    }
    if (pxVar2[1] == '!') {
      xVar1 = pxVar2[2];
      if (xVar1 == '-') {
        xmlParseComment(ctxt);
        return;
      }
      if (xVar1 == 'A') {
        xmlParseAttributeListDecl(ctxt);
        return;
      }
      if (xVar1 == 'N') {
        xmlParseNotationDecl(ctxt);
        return;
      }
      if (xVar1 == 'E') {
        if (pxVar2[3] == 'N') {
          xmlParseEntityDecl(ctxt);
          return;
        }
        if (pxVar2[3] == 'L') {
          xmlParseElementDecl(ctxt);
          return;
        }
      }
      pxVar3->cur = pxVar2 + 2;
      pxVar3->col = pxVar3->col + 2;
      if (pxVar2[2] == '\0') {
        xmlParserGrow(ctxt);
        return;
      }
    }
  }
  return;
}

Assistant:

void
xmlParseMarkupDecl(xmlParserCtxtPtr ctxt) {
    GROW;
    if (CUR == '<') {
        if (NXT(1) == '!') {
	    switch (NXT(2)) {
	        case 'E':
		    if (NXT(3) == 'L')
			xmlParseElementDecl(ctxt);
		    else if (NXT(3) == 'N')
			xmlParseEntityDecl(ctxt);
                    else
                        SKIP(2);
		    break;
	        case 'A':
		    xmlParseAttributeListDecl(ctxt);
		    break;
	        case 'N':
		    xmlParseNotationDecl(ctxt);
		    break;
	        case '-':
		    xmlParseComment(ctxt);
		    break;
		default:
		    /* there is an error but it will be detected later */
                    SKIP(2);
		    break;
	    }
	} else if (NXT(1) == '?') {
	    xmlParsePI(ctxt);
	}
    }
}